

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O1

void adios2::core::engine::ssc::SerializeAttributes(IO *input,Buffer *output)

{
  undefined8 *puVar1;
  uint8_t *puVar2;
  undefined8 *puVar3;
  uint8_t *puVar4;
  long lVar5;
  void *__src;
  undefined8 uVar6;
  long lVar7;
  Attribute *pAVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  size_t __n;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  IO *local_218;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_218 = input;
  lVar7 = adios2::core::IO::GetAttributes_abi_cxx11_();
  puVar3 = *(undefined8 **)(lVar7 + 0x10);
  do {
    if (puVar3 == (undefined8 *)0x0) {
      return;
    }
    lVar7 = *(long *)output->m_Buffer;
    Buffer::resize(output,lVar7 + 0x400);
    if (0xe < *(int *)(puVar3[5] + 0x28) - 1U) goto LAB_00134f16;
    puVar1 = puVar3 + 1;
    switch(*(int *)(puVar3[5] + 0x28)) {
    case 1:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<signed_char>
                         (local_218,puVar1,local_238,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] != (Attribute)0x1) goto LAB_00134eec;
      goto LAB_00134582;
    case 2:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_170[0] = local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<short>
                         (local_218,puVar1,local_238,(string *)local_170);
      puVar9 = local_160;
      puVar10 = local_170[0];
      goto LAB_00134a92;
    case 3:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      puVar9 = local_80;
      local_90[0] = puVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<int>
                         (local_218,puVar1,local_238,(string *)local_90);
      puVar10 = local_90[0];
      goto LAB_00134c87;
    case 4:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_210[0] = local_200;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<long>
                         (local_218,puVar1,local_238,(string *)local_210);
      if (local_210[0] != local_200) {
        operator_delete(local_210[0]);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] != (Attribute)0x1) goto LAB_00134eec;
      goto LAB_0013498e;
    case 5:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      puVar9 = local_a0;
      local_b0[0] = puVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<unsigned_char>
                         (local_218,puVar1,local_238,(string *)local_b0);
      puVar10 = local_b0[0];
      goto LAB_00134516;
    case 6:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_190[0] = local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<unsigned_short>
                         (local_218,puVar1,local_238,(string *)local_190);
      puVar9 = local_180;
      puVar10 = local_190[0];
LAB_00134a92:
      if (puVar10 != puVar9) {
        operator_delete(puVar10);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] == (Attribute)0x1) {
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar7;
        puVar2[0] = '\x02';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(undefined2 *)(puVar4 + lVar7 + 8) = *(undefined2 *)(pAVar8 + 0x58);
        lVar7 = lVar7 + 10;
      }
      else {
LAB_00134eec:
        __src = *(void **)(pAVar8 + 0x40);
        __n = *(long *)(pAVar8 + 0x48) - (long)__src;
        puVar2 = output->m_Buffer;
        *(size_t *)(puVar2 + lVar7) = __n;
        memcpy((size_t *)((long)(puVar2 + lVar7) + 8),__src,__n);
        lVar7 = lVar7 + __n + 8;
      }
      break;
    case 7:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      puVar9 = local_c0;
      local_d0[0] = puVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<unsigned_int>
                         (local_218,puVar1,local_238,(string *)local_d0);
      puVar10 = local_d0[0];
LAB_00134c87:
      if (puVar10 != puVar9) {
        operator_delete(puVar10);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] == (Attribute)0x1) {
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar7;
        puVar2[0] = '\x04';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(undefined4 *)(puVar4 + lVar7 + 8) = *(undefined4 *)(pAVar8 + 0x58);
LAB_00134ee6:
        lVar7 = lVar7 + 0xc;
        break;
      }
      goto LAB_00134eec;
    case 8:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_1b0[0] = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<unsigned_long>
                         (local_218,puVar1,local_238,(string *)local_1b0);
      puVar9 = local_1a0;
      puVar10 = local_1b0[0];
      goto LAB_00134924;
    case 9:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<float>
                         (local_218,puVar1,local_238,(string *)local_f0);
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0]);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] != (Attribute)0x1) goto LAB_00134eec;
      puVar4 = output->m_Buffer;
      puVar2 = puVar4 + lVar7;
      puVar2[0] = '\x04';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(undefined4 *)(puVar4 + lVar7 + 8) = *(undefined4 *)(pAVar8 + 0x58);
      goto LAB_00134ee6;
    case 10:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<double>
                         (local_218,puVar1,local_238,(string *)local_1d0);
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0]);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] != (Attribute)0x1) goto LAB_00134eec;
      puVar4 = output->m_Buffer;
      puVar2 = puVar4 + lVar7;
      puVar2[0] = '\b';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(undefined8 *)(puVar4 + lVar7 + 8) = *(undefined8 *)(pAVar8 + 0x58);
      goto LAB_001349a3;
    case 0xb:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_110[0] = local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<long_double>
                         (local_218,puVar1,local_238,(string *)local_110);
      if (local_110[0] != local_100) {
        operator_delete(local_110[0]);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] != (Attribute)0x1) goto LAB_00134eec;
      puVar4 = output->m_Buffer;
      puVar2 = puVar4 + lVar7;
      puVar2[0] = '\x10';
      puVar2[1] = '\0';
      puVar2[2] = '\0';
      puVar2[3] = '\0';
      puVar2[4] = '\0';
      puVar2[5] = '\0';
      puVar2[6] = '\0';
      puVar2[7] = '\0';
      *(unkbyte10 *)(puVar4 + lVar7 + 8) = *(unkbyte10 *)(pAVar8 + 0x60);
LAB_00134df5:
      lVar7 = lVar7 + 0x18;
      break;
    case 0xc:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_1f0[0] = local_1e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<std::complex<float>>
                         (local_218,puVar1,local_238,(string *)local_1f0);
      puVar9 = local_1e0;
      puVar10 = local_1f0[0];
LAB_00134924:
      if (puVar10 != puVar9) {
        operator_delete(puVar10);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] == (Attribute)0x1) {
LAB_0013498e:
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar7;
        puVar2[0] = '\b';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(undefined8 *)(puVar4 + lVar7 + 8) = *(undefined8 *)(pAVar8 + 0x58);
LAB_001349a3:
        lVar7 = lVar7 + 0x10;
        break;
      }
      goto LAB_00134eec;
    case 0xd:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_130[0] = local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<std::complex<double>>
                         (local_218,puVar1,local_238,(string *)local_130);
      if (local_130[0] != local_120) {
        operator_delete(local_130[0]);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] == (Attribute)0x1) {
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar7;
        puVar2[0] = '\x10';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        uVar6 = *(undefined8 *)(pAVar8 + 0x60);
        puVar4 = puVar4 + lVar7 + 8;
        *(undefined8 *)puVar4 = *(undefined8 *)(pAVar8 + 0x58);
        *(undefined8 *)(puVar4 + 8) = uVar6;
        goto LAB_00134df5;
      }
      goto LAB_00134eec;
    case 0xe:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      local_150[0] = local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<std::__cxx11::string>
                         (local_218,puVar1,local_238,(string *)local_150);
      if (local_150[0] != local_140) {
        operator_delete(local_150[0]);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar5 = *(long *)(pAVar8 + 0x10);
      puVar2 = output->m_Buffer;
      *(undefined8 *)(puVar2 + lVar5 + lVar7 + 0xb + -8) = *(undefined8 *)(pAVar8 + 0x60);
      memcpy(puVar2 + lVar5 + lVar7 + 0xb,*(void **)(pAVar8 + 0x58),*(size_t *)(pAVar8 + 0x60));
      lVar7 = lVar7 + lVar5 + 0xb + *(long *)(pAVar8 + 0x60);
      break;
    case 0xf:
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"");
      puVar9 = local_40;
      local_50[0] = puVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/","");
      pAVar8 = adios2::core::IO::InquireAttribute<char>
                         (local_218,puVar1,local_238,(string *)local_50);
      puVar10 = local_50[0];
LAB_00134516:
      if (puVar10 != puVar9) {
        operator_delete(puVar10);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0]);
      }
      output->m_Buffer[lVar7] = 'B';
      *(Attribute *)(output->m_Buffer + lVar7 + 1) = pAVar8[0x28];
      *(Attribute *)(output->m_Buffer + lVar7 + 2) = pAVar8[0x10];
      memcpy(output->m_Buffer + lVar7 + 3,*(void **)(pAVar8 + 8),*(size_t *)(pAVar8 + 0x10));
      lVar7 = lVar7 + 3 + *(long *)(pAVar8 + 0x10);
      if (pAVar8[0x38] == (Attribute)0x1) {
LAB_00134582:
        puVar4 = output->m_Buffer;
        puVar2 = puVar4 + lVar7;
        puVar2[0] = '\x01';
        puVar2[1] = '\0';
        puVar2[2] = '\0';
        puVar2[3] = '\0';
        puVar2[4] = '\0';
        puVar2[5] = '\0';
        puVar2[6] = '\0';
        puVar2[7] = '\0';
        *(Attribute *)(puVar4 + lVar7 + 8) = pAVar8[0x58];
        lVar7 = lVar7 + 9;
        break;
      }
      goto LAB_00134eec;
    }
LAB_00134f16:
    *(long *)output->m_Buffer = lVar7;
    puVar3 = (undefined8 *)*puVar3;
  } while( true );
}

Assistant:

void SerializeAttributes(IO &input, Buffer &output)
{
    const auto &attributeMap = input.GetAttributes();
    for (const auto &attributePair : attributeMap)
    {
        uint64_t pos = output.value<uint64_t>();
        output.resize(pos + 1024);

        if (attributePair.second->m_Type == DataType::String)
        {
            const auto &attribute = input.InquireAttribute<std::string>(attributePair.first);
            output[pos] = 66;
            ++pos;
            output[pos] = static_cast<uint8_t>(attribute->m_Type);
            ++pos;
            output[pos] = static_cast<uint8_t>(attribute->m_Name.size());
            ++pos;
            std::memcpy(output.data(pos), attribute->m_Name.data(), attribute->m_Name.size());
            pos += attribute->m_Name.size();
            output.value<uint64_t>(pos) = attribute->m_DataSingleValue.size();
            pos += 8;
            std::memcpy(output.data(pos), attribute->m_DataSingleValue.data(),
                        attribute->m_DataSingleValue.size());
            pos += attribute->m_DataSingleValue.size();
        }
#define declare_type(T)                                                                            \
    else if (attributePair.second->m_Type == helper::GetDataType<T>())                             \
    {                                                                                              \
        const auto &attribute = input.InquireAttribute<T>(attributePair.first);                    \
        output[pos] = 66;                                                                          \
        ++pos;                                                                                     \
        output[pos] = static_cast<uint8_t>(attribute->m_Type);                                     \
        ++pos;                                                                                     \
        output[pos] = static_cast<uint8_t>(attribute->m_Name.size());                              \
        ++pos;                                                                                     \
        std::memcpy(output.data(pos), attribute->m_Name.data(), attribute->m_Name.size());         \
        pos += attribute->m_Name.size();                                                           \
        if (attribute->m_IsSingleValue)                                                            \
        {                                                                                          \
            output.value<uint64_t>(pos) = sizeof(T);                                               \
            pos += 8;                                                                              \
            output.value<T>(pos) = attribute->m_DataSingleValue;                                   \
            pos += sizeof(T);                                                                      \
        }                                                                                          \
        else                                                                                       \
        {                                                                                          \
            uint64_t size = sizeof(T) * attribute->m_DataArray.size();                             \
            output.value<uint64_t>(pos) = size;                                                    \
            pos += 8;                                                                              \
            std::memcpy(output.data(pos), attribute->m_DataArray.data(), size);                    \
            pos += size;                                                                           \
        }                                                                                          \
    }
        ADIOS2_FOREACH_ATTRIBUTE_STDTYPE_1ARG(declare_type)
#undef declare_type
        output.value<uint64_t>() = pos;
    }
}